

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_lat.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t __size;
  void *__s;
  uint64_t uVar7;
  undefined1 auVar8 [16];
  double lat;
  uint64_t total;
  nn_stopwatch sw;
  uint local_48;
  int opt;
  int i;
  int rc;
  int s;
  int nbytes;
  char *buf;
  int rts;
  size_t sz;
  char *connect_to;
  char **argv_local;
  int argc_local;
  
  if (argc == 4) {
    pcVar1 = argv[1];
    uVar2 = atoi(argv[2]);
    __size = (size_t)(int)uVar2;
    uVar3 = atoi(argv[3]);
    iVar4 = nn_socket(1,0x10);
    if (iVar4 == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x3b,"int main(int, char **)");
    }
    sw.start._4_4_ = 1;
    iVar5 = nn_setsockopt(iVar4,0xfffffffd,1,(undefined1 *)((long)&sw.start + 4),4);
    if (iVar5 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x3e,"int main(int, char **)");
    }
    iVar5 = nn_connect(iVar4,pcVar1);
    if (iVar5 < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x40,"int main(int, char **)");
    }
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x43,"int main(int, char **)");
    }
    memset(__s,0x6f,__size);
    nn_stopwatch_init((nn_stopwatch *)&total);
    for (local_48 = 0; local_48 != uVar3; local_48 = local_48 + 1) {
      uVar6 = nn_send(iVar4,__s,__size,0);
      if (uVar6 != uVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                      ,0x49,"int main(int, char **)");
      }
      uVar6 = nn_recv(iVar4,__s,__size,0);
      if (uVar6 != uVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                      ,0x4b,"int main(int, char **)");
      }
    }
    uVar7 = nn_stopwatch_term((nn_stopwatch *)&total);
    auVar8._8_4_ = (int)(uVar7 >> 0x20);
    auVar8._0_8_ = uVar7;
    auVar8._12_4_ = 0x45300000;
    printf("message size: %d [B]\n",(ulong)uVar2);
    printf("roundtrip count: %d\n",(ulong)uVar3);
    printf("average latency: %.3f [us]\n",
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
           (double)(int)(uVar3 << 1));
    free(__s);
    iVar4 = nn_close(iVar4);
    if (iVar4 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x57,"int main(int, char **)");
    }
    argv_local._4_4_ = 0;
  }
  else {
    printf("usage: remote_lat <connect-to> <msg-size> <roundtrips>\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv [])
{
    const char *connect_to;
    size_t sz;
    int rts;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;
    int opt;
    struct nn_stopwatch sw;
    uint64_t total;
    double lat;


    if (argc != 4) {
        printf ("usage: remote_lat <connect-to> <msg-size> <roundtrips>\n");
        return 1;
    }
    connect_to = argv [1];
    sz = atoi (argv [2]);
    rts = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    opt = 1;
    rc = nn_setsockopt (s, NN_TCP, NN_TCP_NODELAY, &opt, sizeof (opt));
    assert (rc == 0);
    rc = nn_connect (s, connect_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    nn_stopwatch_init (&sw);
    for (i = 0; i != rts; i++) {
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
        nbytes = nn_recv (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }
    total = nn_stopwatch_term (&sw);

    lat = (double) total / (rts * 2);
    printf ("message size: %d [B]\n", (int) sz);
    printf ("roundtrip count: %d\n", (int) rts);
    printf ("average latency: %.3f [us]\n", (double) lat);

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}